

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtype.cc
# Opt level: O3

bool __thiscall verona::Sequent::lhs_reduce(Sequent *this,Btype *t)

{
  bool bVar1;
  Sequent seq;
  Sequent local_f0;
  
  Sequent(&local_f0,this);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  push_back(&local_f0.lhs_pending,(value_type *)t);
  bVar1 = reduce(&local_f0);
  if (bVar1) {
    merge(&this->bounds,&local_f0.bounds);
  }
  std::
  _Rb_tree<trieste::Location,_std::pair<const_trieste::Location,_verona::Bound>,_std::_Select1st<std::pair<const_trieste::Location,_verona::Bound>_>,_std::less<trieste::Location>,_std::allocator<std::pair<const_trieste::Location,_verona::Bound>_>_>
  ::~_Rb_tree(&local_f0.bounds._M_t);
  std::vector<verona::Assume,_std::allocator<verona::Assume>_>::~vector(&local_f0.assumptions);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  ~vector(&local_f0.predicates);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  ~vector(&local_f0.self);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  ~vector(&local_f0.rhs_atomic);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  ~vector(&local_f0.lhs_atomic);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  ~vector(&local_f0.rhs_pending);
  std::
  vector<std::shared_ptr<verona::BtypeDef>,_std::allocator<std::shared_ptr<verona::BtypeDef>_>_>::
  ~vector(&local_f0.lhs_pending);
  return bVar1;
}

Assistant:

bool lhs_reduce(Btype t)
    {
      Sequent seq(*this);
      seq.lhs_pending.push_back(t);

      if (!seq.reduce())
        return false;

      merge(bounds, seq.bounds);
      return true;
    }